

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

_Bool resolve_params(SolverParams *params,SolverDescriptor *desc,SolverTypedParams *out)

{
  char *pcVar1;
  size_t sVar2;
  _Bool _Var3;
  SolverTypedParamsEntry *pSVar4;
  FILE *pFVar5;
  _Bool _Var6;
  int iVar7;
  char *pcVar8;
  SolverTypedParamsEntry *pSVar9;
  int local_50;
  undefined1 local_48 [8];
  TypedParam t;
  char *pcStack_30;
  int32_t pi;
  char *value;
  int32_t di;
  _Bool result;
  SolverTypedParams *out_local;
  SolverDescriptor *desc_local;
  SolverParams *params_local;
  
  solver_typed_params_destroy(out);
  _Var3 = true;
  value._0_4_ = 0;
  do {
    if (desc[(long)(int)value * 4 + 1].name == (char *)0x0) {
LAB_00107b4f:
      if (_Var3 == false) {
        solver_typed_params_destroy(out);
      }
      return _Var3;
    }
    pcStack_30 = (char *)0x0;
    t.field_2.sizeval._4_4_ = 0;
    while( true ) {
      if (params->num_params < 0x101) {
        local_50 = params->num_params;
      }
      else {
        local_50 = 0x100;
      }
      if (local_50 <= (int)t.field_2.sizeval._4_4_) break;
      iVar7 = strcmp(params->params[(int)t.field_2.sizeval._4_4_].name,
                     desc[(long)(int)value * 4 + 1].name);
      if (iVar7 == 0) {
        if (pcStack_30 != (char *)0x0) {
          fprintf(_stderr,"ERROR: parameter `%s` specified twice or more.\n",
                  params->params[(int)t.field_2.sizeval._4_4_].name);
          _Var3 = false;
          goto LAB_00107b4f;
        }
        pcStack_30 = params->params[(int)t.field_2.sizeval._4_4_].value;
      }
      t.field_2.sizeval._4_4_ = t.field_2.sizeval._4_4_ + 1;
    }
    if (pcStack_30 == (char *)0x0) {
      pcStack_30 = desc[(long)(int)value * 4 + 3].name;
    }
    memset(local_48,0,0x10);
    pFVar5 = _stderr;
    local_48._4_4_ = *(undefined4 *)&desc[(long)(int)value * 4 + 2].name;
    if (pcStack_30 == (char *)0x0) {
      local_48._0_4_ = 0;
    }
    else {
      local_48._0_4_ = 1;
      pcVar1 = desc[(long)(int)value * 4 + 1].name;
      pcVar8 = param_type_as_str(*(ParamType *)&desc[(long)(int)value * 4 + 2].name);
      fprintf(pFVar5,"%s :: Setting `%s` (%s) to value `%s`\n","resolve_params",pcVar1,pcVar8,
              pcStack_30);
      _Var6 = parse_solver_param_val
                        ((TypedParam *)local_48,pcStack_30,
                         *(ParamType *)&desc[(long)(int)value * 4 + 2].name);
      pFVar5 = _stderr;
      if (!_Var6) {
        pcVar1 = desc[(long)(int)value * 4 + 1].name;
        pcVar8 = param_type_as_str(*(ParamType *)&desc[(long)(int)value * 4 + 2].name);
        fprintf(pFVar5,"ERROR: Failed to parse param `%s=%s` required as a %s\n",pcVar1,pcStack_30,
                pcVar8);
        _Var3 = false;
        goto LAB_00107b4f;
      }
    }
    pSVar9 = (SolverTypedParamsEntry *)
             stbds_hmput_key(out->entries,0x18,desc[(long)(int)value * 4 + 1].name,8,1);
    out->entries = pSVar9;
    pSVar9 = out->entries;
    sVar2 = out->entries[-2].value.field_2.sizeval;
    pSVar4 = pSVar9 + sVar2;
    (pSVar4->value).count = local_48._0_4_;
    (pSVar4->value).type = local_48._4_4_;
    pSVar9[sVar2].value.field_2 = (anon_union_8_6_a07caa68_for_TypedParam_2)t._0_8_;
    value._0_4_ = (int)value + 1;
  } while( true );
}

Assistant:

bool resolve_params(const SolverParams *params, const SolverDescriptor *desc,
                    SolverTypedParams *out) {
    solver_typed_params_destroy(out);
    bool result = true;

    for (int32_t di = 0; desc->params[di].name != 0; di++) {
        const char *value = NULL;
        for (int32_t pi = 0;
             pi < MIN(MAX_NUM_SOLVER_PARAMS, params->num_params); pi++) {
            if (0 == strcmp(params->params[pi].name, desc->params[di].name)) {
                if (value) {
                    fprintf(stderr,
                            "ERROR: parameter `%s` specified twice or more.\n",
                            params->params[pi].name);
                    result = false;
                    goto terminate;
                }
                value = params->params[pi].value;
            }
        }

        // If the user didn't specify any value get the default value from the
        // descriptor
        if (!value) {
            value = desc->params[di].default_value;
        }

        // NOTE:
        // The descriptor may not contain a default_value: therefore
        // `value` may still be NULL
        TypedParam t = {0};
        t.type = desc->params[di].type;

        if (!value) {
            t.count = 0;
        } else {
            t.count = 1;

            fprintf(stderr, "%s :: Setting `%s` (%s) to value `%s`\n", __func__,
                    desc->params[di].name,
                    param_type_as_str(desc->params[di].type), value);

            if (!parse_solver_param_val(&t, value, desc->params[di].type)) {
                fprintf(
                    stderr,
                    "ERROR: Failed to parse param `%s=%s` required as a %s\n",
                    desc->params[di].name, value,
                    param_type_as_str(desc->params[di].type));
                result = false;
                goto terminate;
            }
        }

        shput(out->entries, desc->params[di].name, t);
    }

terminate:
    if (!result) {
        solver_typed_params_destroy(out);
    }
    return result;
}